

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

vector<Lit,_std::allocator<Lit>_> * __thiscall
GraphPropagator::fullExpl(GraphPropagator *this,bool fail)

{
  bool bVar1;
  int iVar2;
  byte in_DL;
  vector<Lit,_std::allocator<Lit>_> *in_RDI;
  int i_1;
  int i;
  vector<Lit,_std::allocator<Lit>_> *ps;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  Lit in_stack_ffffffffffffff64;
  undefined4 local_30;
  undefined4 local_28;
  
  std::vector<Lit,_std::allocator<Lit>_>::vector((vector<Lit,_std::allocator<Lit>_> *)0x2a86a9);
  if ((in_DL & 1) == 0) {
    std::vector<Lit,_std::allocator<Lit>_>::emplace_back<>
              ((vector<Lit,_std::allocator<Lit>_> *)
               CONCAT44(in_stack_ffffffffffffff64.x,in_stack_ffffffffffffff60));
  }
  for (local_28 = 0; iVar2 = nbNodes((GraphPropagator *)0x2a8704), local_28 < iVar2;
      local_28 = local_28 + 1) {
    getNodeVar((GraphPropagator *)CONCAT44(in_stack_ffffffffffffff64.x,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
    bVar1 = BoolView::isFixed((BoolView *)0x2a873c);
    if (bVar1) {
      getNodeVar((GraphPropagator *)CONCAT44(in_stack_ffffffffffffff64.x,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
      BoolView::getValLit((BoolView *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
      ;
      std::vector<Lit,_std::allocator<Lit>_>::push_back
                ((vector<Lit,_std::allocator<Lit>_> *)
                 CONCAT44(in_stack_ffffffffffffff64.x,in_stack_ffffffffffffff60),
                 (value_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
  }
  for (local_30 = 0; iVar2 = nbEdges((GraphPropagator *)0x2a87c1), local_30 < iVar2;
      local_30 = local_30 + 1) {
    getEdgeVar((GraphPropagator *)CONCAT44(in_stack_ffffffffffffff64.x,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
    bVar1 = BoolView::isFixed((BoolView *)0x2a87f6);
    if (bVar1) {
      getEdgeVar((GraphPropagator *)CONCAT44(in_stack_ffffffffffffff64.x,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
      in_stack_ffffffffffffff64 =
           BoolView::getValLit((BoolView *)
                               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      std::vector<Lit,_std::allocator<Lit>_>::push_back
                ((vector<Lit,_std::allocator<Lit>_> *)
                 CONCAT44(in_stack_ffffffffffffff64.x,in_stack_ffffffffffffff60),
                 (value_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
  }
  return in_RDI;
}

Assistant:

std::vector<Lit> GraphPropagator::fullExpl(bool fail) {
	std::vector<Lit> ps;
	if (!fail) {
		ps.emplace_back();
	}
	for (int i = 0; i < nbNodes(); i++) {
		if (getNodeVar(i).isFixed()) {
			ps.push_back(getNodeVar(i).getValLit());
		}
	}
	for (int i = 0; i < nbEdges(); i++) {
		if (getEdgeVar(i).isFixed()) {
			ps.push_back(getEdgeVar(i).getValLit());
		}
	}
	return ps;
}